

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinMd5
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator_type *in_RCX;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar2;
  string value;
  string local_b8;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_98;
  string local_80;
  UString local_60;
  string local_40;
  
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"md5","");
  local_60._M_dataplus._M_p._0_4_ = 0x13;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_60;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_98,__l,in_RCX);
  validateBuiltinArgs(this,loc,&local_b8,args,&local_98);
  if (local_98.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  encode_utf8(&local_b8,
              (UString *)
              ((((args->
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                 )._M_impl.super__Vector_impl_data._M_start)->v).h + 1));
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_b8._M_dataplus._M_p,
             local_b8._M_dataplus._M_p + local_b8._M_string_length);
  md5(&local_40,&local_80);
  decode_utf8(&local_60,&local_40);
  VVar2 = makeString(this,&local_60);
  (this->scratch).t = STRING;
  (this->scratch).v = VVar2._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_),
                    local_60.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinMd5(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "md5", args, {Value::STRING});

        std::string value = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);

        scratch = makeString(decode_utf8(md5(value)));
        return nullptr;
    }